

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindStates(lemon *lemp)

{
  char *key;
  rule *prVar1;
  symbol *psVar2;
  config *pcVar3;
  rule **pprVar4;
  int i;
  long lVar5;
  
  Configlist_init();
  key = lemp->start;
  if (key != (char *)0x0) {
    psVar2 = Symbol_find(key);
    if (psVar2 != (symbol *)0x0) goto LAB_00103abd;
    ErrorMsg(lemp->filename,0,
             "The specified start symbol \"%s\" is not in a nonterminal of the grammar.  \"%s\" will be used as the start symbol instead."
             ,key,lemp->startRule->lhs->name);
    lemp->errorcnt = lemp->errorcnt + 1;
  }
  psVar2 = lemp->startRule->lhs;
LAB_00103abd:
  pprVar4 = &lemp->rule;
  while (prVar1 = *pprVar4, prVar1 != (rule *)0x0) {
    for (lVar5 = 0; lVar5 < prVar1->nrhs; lVar5 = lVar5 + 1) {
      if (prVar1->rhs[lVar5] == psVar2) {
        ErrorMsg(lemp->filename,0,
                 "The start symbol \"%s\" occurs on the right-hand side of a rule. This will result in a parser which does not work properly."
                 ,psVar2->name);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
    }
    pprVar4 = &prVar1->next;
  }
  pprVar4 = &psVar2->rule;
  while (prVar1 = *pprVar4, prVar1 != (rule *)0x0) {
    prVar1->lhsStart = 1;
    pcVar3 = Configlist_addbasis(prVar1,0);
    SetAdd(pcVar3->fws,0);
    pprVar4 = &prVar1->nextlhs;
  }
  getstate(lemp);
  return;
}

Assistant:

void FindStates(struct lemon *lemp)
{
  struct symbol *sp;
  struct rule *rp;

  Configlist_init();

  /* Find the start symbol */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      ErrorMsg(lemp->filename,0,
"The specified start symbol \"%s\" is not \
in a nonterminal of the grammar.  \"%s\" will be used as the start \
symbol instead.",lemp->start,lemp->startRule->lhs->name);
      lemp->errorcnt++;
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }

  /* Make sure the start symbol doesn't occur on the right-hand side of
  ** any rule.  Report an error if it does.  (YACC would generate a new
  ** start symbol in this case.) */
  for(rp=lemp->rule; rp; rp=rp->next){
    int i;
    for(i=0; i<rp->nrhs; i++){
      if( rp->rhs[i]==sp ){   /* FIX ME:  Deal with multiterminals */
        ErrorMsg(lemp->filename,0,
"The start symbol \"%s\" occurs on the \
right-hand side of a rule. This will result in a parser which \
does not work properly.",sp->name);
        lemp->errorcnt++;
      }
    }
  }

  /* The basis configuration set for the first state
  ** is all rules which have the start symbol as their
  ** left-hand side */
  for(rp=sp->rule; rp; rp=rp->nextlhs){
    struct config *newcfp;
    rp->lhsStart = 1;
    newcfp = Configlist_addbasis(rp,0);
    SetAdd(newcfp->fws,0);
  }

  /* Compute the first state.  All other states will be
  ** computed automatically during the computation of the first one.
  ** The returned pointer to the first state is not used. */
  (void)getstate(lemp);
  return;
}